

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

int compareVideoModes(void *firstPtr,void *secondPtr)

{
  int iVar1;
  
  iVar1 = (*(int *)((long)firstPtr + 0xc) + *(int *)((long)firstPtr + 8) +
          *(int *)((long)firstPtr + 0x10)) -
          (*(int *)((long)secondPtr + 0xc) + *(int *)((long)secondPtr + 8) +
          *(int *)((long)secondPtr + 0x10));
  if ((iVar1 == 0) &&
     (iVar1 = *(int *)((long)firstPtr + 4) * *firstPtr - *(int *)((long)secondPtr + 4) * *secondPtr,
     iVar1 == 0)) {
    iVar1 = *(int *)((long)firstPtr + 0x14) - *(int *)((long)secondPtr + 0x14);
  }
  return iVar1;
}

Assistant:

static int compareVideoModes(const void* firstPtr, const void* secondPtr)
{
    int firstBPP, secondBPP, firstSize, secondSize;
    GLFWvidmode* first = (GLFWvidmode*) firstPtr;
    GLFWvidmode* second = (GLFWvidmode*) secondPtr;

    // First sort on color bits per pixel

    firstBPP = first->redBits +
               first->greenBits +
               first->blueBits;
    secondBPP = second->redBits +
                second->greenBits +
                second->blueBits;

    if (firstBPP != secondBPP)
        return firstBPP - secondBPP;

    // Then sort on screen area, in pixels

    firstSize = first->width * first->height;
    secondSize = second->width * second->height;

    if (firstSize != secondSize)
        return firstSize - secondSize;

    // Lastly sort on refresh rate

    return first->refreshRate - second->refreshRate;
}